

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O2

int32_t MBCS_FROM_UCHAR32_ISO2022
                  (UConverterSharedData *sharedData,UChar32 c,uint32_t *value,UBool useFallback,
                  int outputType)

{
  uint uVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  int32_t *cx;
  long lVar4;
  int iVar5;
  int32_t iVar6;
  uint32_t uVar7;
  uint uVar8;
  bool bVar9;
  
  if ((0xffff < c) && (((sharedData->mbcs).unicodeMask & 1) == 0)) goto LAB_002f353d;
  puVar2 = (sharedData->mbcs).fromUnicodeTable;
  puVar3 = (sharedData->mbcs).fromUnicodeBytes;
  uVar1 = *(uint *)(puVar2 + (ulong)(((uint)c >> 4 & 0x3f) + (uint)puVar2[c >> 10]) * 2);
  uVar8 = (uVar1 & 0xffff) << 4 | c & 0xfU;
  if (outputType == 1) {
    uVar7 = (uint32_t)*(ushort *)(puVar3 + (ulong)uVar8 * 2);
    bVar9 = *(ushort *)(puVar3 + (ulong)uVar8 * 2) < 0x100;
    iVar5 = 2;
LAB_002f34f6:
    iVar5 = iVar5 - (uint)bVar9;
  }
  else {
    lVar4 = (ulong)uVar8 * 3;
    uVar8 = (uint)puVar3[lVar4 + 1] << 8 | (uint)puVar3[lVar4] << 0x10;
    uVar7 = puVar3[lVar4 + 2] | uVar8;
    if (uVar8 != 0) {
      bVar9 = puVar3[lVar4] == 0;
      iVar5 = 3;
      goto LAB_002f34f6;
    }
    iVar5 = 1;
  }
  if (((uVar1 >> (sbyte)(c & 0xfU)) >> 0x10 & 1) != 0) {
    *value = uVar7;
    return iVar5;
  }
  if (((c - 0xe000U < 0x1900 || useFallback != '\0') || (c - 0xf0000U < 0x20000)) && (uVar7 != 0)) {
    *value = uVar7;
    return -iVar5;
  }
LAB_002f353d:
  cx = (sharedData->mbcs).extIndexes;
  if (cx != (int32_t *)0x0) {
    iVar6 = ucnv_extSimpleMatchFromU_63(cx,c,value,useFallback);
    return iVar6;
  }
  return 0;
}

Assistant:

static inline int32_t
MBCS_FROM_UCHAR32_ISO2022(UConverterSharedData* sharedData,
                                         UChar32 c,
                                         uint32_t* value,
                                         UBool useFallback,
                                         int outputType)
{
    const int32_t *cx;
    const uint16_t *table;
    uint32_t stage2Entry;
    uint32_t myValue;
    int32_t length;
    const uint8_t *p;
    /*
     * TODO(markus): Use and require new, faster MBCS conversion table structures.
     * Use internal version of ucnv_open() that verifies that the new structures are available,
     * else U_INTERNAL_PROGRAM_ERROR.
     */
    /* BMP-only codepages are stored without stage 1 entries for supplementary code points */
    if(c<0x10000 || (sharedData->mbcs.unicodeMask&UCNV_HAS_SUPPLEMENTARY)) {
        table=sharedData->mbcs.fromUnicodeTable;
        stage2Entry=MBCS_STAGE_2_FROM_U(table, c);
        /* get the bytes and the length for the output */
        if(outputType==MBCS_OUTPUT_2){
            myValue=MBCS_VALUE_2_FROM_STAGE_2(sharedData->mbcs.fromUnicodeBytes, stage2Entry, c);
            if(myValue<=0xff) {
                length=1;
            } else {
                length=2;
            }
        } else /* outputType==MBCS_OUTPUT_3 */ {
            p=MBCS_POINTER_3_FROM_STAGE_2(sharedData->mbcs.fromUnicodeBytes, stage2Entry, c);
            myValue=((uint32_t)*p<<16)|((uint32_t)p[1]<<8)|p[2];
            if(myValue<=0xff) {
                length=1;
            } else if(myValue<=0xffff) {
                length=2;
            } else {
                length=3;
            }
        }
        /* is this code point assigned, or do we use fallbacks? */
        if((stage2Entry&(1<<(16+(c&0xf))))!=0) {
            /* assigned */
            *value=myValue;
            return length;
        } else if(FROM_U_USE_FALLBACK(useFallback, c) && myValue!=0) {
            /*
             * We allow a 0 byte output if the "assigned" bit is set for this entry.
             * There is no way with this data structure for fallback output
             * to be a zero byte.
             */
            *value=myValue;
            return -length;
        }
    }

    cx=sharedData->mbcs.extIndexes;
    if(cx!=NULL) {
        return ucnv_extSimpleMatchFromU(cx, c, value, useFallback);
    }

    /* unassigned */
    return 0;
}